

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

Attribute * Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::makeNewAttribute(void)

{
  Attribute *pAVar1;
  TypedAttribute<Imf_2_5::ChannelList> *in_stack_fffffffffffffff0;
  
  pAVar1 = (Attribute *)operator_new(0x38);
  pAVar1[4]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[5]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[2]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[3]._vptr_Attribute = (_func_int **)0x0;
  pAVar1->_vptr_Attribute = (_func_int **)0x0;
  pAVar1[1]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[6]._vptr_Attribute = (_func_int **)0x0;
  TypedAttribute(in_stack_fffffffffffffff0);
  return pAVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}